

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultFrontLoadedReporter.cpp
# Opt level: O1

void __thiscall
ApprovalTests::DefaultFrontLoadedReporter::DefaultFrontLoadedReporter
          (DefaultFrontLoadedReporter *this)

{
  CIBuildOnlyReporter *this_00;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_59;
  TextDiffReporter *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<ApprovalTests::Reporter> local_48;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_38;
  CIBuildOnlyReporter *local_20;
  
  this_00 = (CIBuildOnlyReporter *)operator_new(0x18);
  local_58 = (TextDiffReporter *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ApprovalTests::TextDiffReporter,std::allocator<ApprovalTests::TextDiffReporter>>
            (&_Stack_50,&local_58,(allocator<ApprovalTests::TextDiffReporter> *)&local_59);
  local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_Reporter;
  local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_50._M_pi;
  local_58 = (TextDiffReporter *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CIBuildOnlyReporter::CIBuildOnlyReporter(this_00,&local_48);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_20;
  local_20 = this_00;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_38,__l,&local_59);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_38);
  if (local_38.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_pi);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001a3c10;
  return;
}

Assistant:

DefaultFrontLoadedReporter::DefaultFrontLoadedReporter()
        : FirstWorkingReporter({new CIBuildOnlyReporter()})
    {
    }